

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O0

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_false>::
update_just_in_time_cards(ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_false> *this)

{
  bool bVar1;
  WrappedInt<Cycles> local_48;
  IntType local_40;
  reference local_38;
  Card **card;
  iterator __end4;
  iterator __begin4;
  vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_> *__range4;
  ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_false> *local_10;
  ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_false> *this_local;
  
  local_10 = this;
  Cycles::Cycles((Cycles *)&__range4,0);
  bVar1 = WrappedInt<Cycles>::operator>
                    (&(this->cycles_since_card_update_).super_WrappedInt<Cycles>,(Cycles *)&__range4
                    );
  if (bVar1) {
    __end4 = std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>::begin
                       (&this->just_in_time_cards_);
    card = (Card **)std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>::end
                              (&this->just_in_time_cards_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end4,(__normal_iterator<Apple::II::Card_**,_std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>_>
                                       *)&card), bVar1) {
      local_38 = __gnu_cxx::
                 __normal_iterator<Apple::II::Card_**,_std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>_>
                 ::operator*(&__end4);
      local_40 = (this->cycles_since_card_update_).super_WrappedInt<Cycles>.length_;
      (*(*local_38)->_vptr_Card[2])
                (*local_38,local_40,(ulong)(uint)this->stretched_cycles_since_card_update_);
      __gnu_cxx::
      __normal_iterator<Apple::II::Card_**,_std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>_>
      ::operator++(&__end4);
    }
  }
  Cycles::Cycles((Cycles *)&local_48,0);
  (this->cycles_since_card_update_).super_WrappedInt<Cycles>.length_ = local_48.length_;
  this->stretched_cycles_since_card_update_ = 0;
  return;
}

Assistant:

void update_just_in_time_cards() {
			if(cycles_since_card_update_ > Cycles(0)) {
				for(const auto &card : just_in_time_cards_) {
					card->run_for(cycles_since_card_update_, stretched_cycles_since_card_update_);
				}
			}
			cycles_since_card_update_ = 0;
			stretched_cycles_since_card_update_ = 0;
		}